

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

WordType llvm::APInt::tcSubtractPart(WordType *dst,WordType src,uint parts)

{
  WordType *pWVar1;
  ulong uVar2;
  WordType WVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  bVar6 = parts == 0;
  if ((!bVar6) && (uVar2 = *dst, *dst = *dst - src, uVar2 < src)) {
    lVar5 = 1;
    do {
      uVar4 = (uint)lVar5;
      if (parts == uVar4) break;
      pWVar1 = dst + lVar5;
      WVar3 = *pWVar1;
      *pWVar1 = *pWVar1 - 1;
      lVar5 = lVar5 + 1;
    } while (WVar3 == 0);
    bVar6 = parts <= uVar4;
  }
  return (ulong)bVar6;
}

Assistant:

APInt::WordType APInt::tcSubtractPart(WordType *dst, WordType src,
                                      unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    WordType Dst = dst[i];
    dst[i] -= src;
    if (src <= Dst)
      return 0; // No need to borrow so exit early.
    src = 1; // We have to "borrow 1" from next "word"
  }

  return 1;
}